

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::Finalize
          (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *this,
          CordRepBtree *tree,OpResult result)

{
  CordRepBtree **ppCVar1;
  uint uVar2;
  uint8_t uVar3;
  CordRepBtree *pCVar4;
  int iVar5;
  byte bVar6;
  CordRepBtree *local_20;
  
  iVar5 = (int)result.tree;
  pCVar4 = tree;
  if (iVar5 != 0) {
    if (iVar5 == 1) {
      if (this == (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                  0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x397,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
      }
      LOCK();
      ppCVar1 = this->stack;
      uVar2 = *(uint *)ppCVar1;
      *(int *)ppCVar1 = *(int *)ppCVar1 + -2;
      UNLOCK();
      if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
        __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0xac,
                      "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
      }
      if (uVar2 == 2) {
        CordRep::Destroy((CordRep *)this);
      }
    }
    else {
      if (iVar5 != 2) {
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x121,
                      "static CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::Finalize(CordRepBtree *, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                     );
      }
      uVar3 = (tree->super_CordRep).storage[0];
      if (uVar3 != *(uint8_t *)((long)this->stack + 5)) {
        __assert_fail("front->height() == back->height()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x294,
                      "static CordRepBtree *absl::cord_internal::CordRepBtree::New(CordRepBtree *, CordRepBtree *)"
                     );
      }
      pCVar4 = (CordRepBtree *)operator_new(0x40);
      (pCVar4->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
      (pCVar4->super_CordRep).length = *(long *)this + (tree->super_CordRep).length;
      bVar6 = uVar3 + 1;
      (pCVar4->super_CordRep).tag = '\x03';
      (pCVar4->super_CordRep).storage[0] = bVar6;
      (pCVar4->super_CordRep).storage[1] = '\0';
      (pCVar4->super_CordRep).storage[2] = '\x02';
      pCVar4->edges_[0] = &tree->super_CordRep;
      pCVar4->edges_[1] = (CordRep *)this;
      if (0xb < bVar6) {
        cord_internal::(anonymous_namespace)::
        StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::Finalize();
        pCVar4 = local_20;
      }
    }
  }
  return pCVar4;
}

Assistant:

static inline CordRepBtree* Finalize(CordRepBtree* tree, OpResult result) {
    switch (result.action) {
      case CordRepBtree::kPopped:
        tree = edge_type == kBack ? CordRepBtree::New(tree, result.tree)
                                  : CordRepBtree::New(result.tree, tree);
        if (ABSL_PREDICT_FALSE(tree->height() > CordRepBtree::kMaxHeight)) {
          tree = CordRepBtree::Rebuild(tree);
          ABSL_RAW_CHECK(tree->height() <= CordRepBtree::kMaxHeight,
                         "Max height exceeded");
        }
        return tree;
      case CordRepBtree::kCopied:
        CordRep::Unref(tree);
        ABSL_FALLTHROUGH_INTENDED;
      case CordRepBtree::kSelf:
        return result.tree;
    }
    ABSL_UNREACHABLE();
    return result.tree;
  }